

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O2

void checkroots(double *phi,int *p,double *theta,int *q,double *PHI,int *P,double *THETA,int *Q)

{
  int iVar1;
  char *__s;
  
  if (0 < *p) {
    iVar1 = archeck(*p,phi);
    if (iVar1 == 0) {
      __s = "\nnon-stationary AR part";
      goto LAB_00110b46;
    }
  }
  if (0 < *q) {
    invertroot(*q,theta);
  }
  if (0 < *P) {
    iVar1 = archeck(*P,PHI);
    if (iVar1 == 0) {
      __s = "\nnon-stationary seasonal AR part";
LAB_00110b46:
      puts(__s);
      exit(-1);
    }
  }
  if (0 < *Q) {
    invertroot(*Q,THETA);
    return;
  }
  return;
}

Assistant:

void checkroots(double *phi, int *p, double *theta, int *q, double *PHI, int *P, double *THETA, int *Q) {
	int ret;

	if (*p > 0) {
		ret = archeck(*p,phi);
		if (!ret) {
			printf("\nnon-stationary AR part\n");
			exit(-1);
		}
	}

	if (*q > 0) {
		invertroot(*q,theta);
	}

	if (*P == *P) {
		if (*P > 0) {
			ret = archeck(*P,PHI);
			if (!ret) {
				printf("\nnon-stationary seasonal AR part\n");
				exit(-1);
			}
		}
	}

	if (*Q == *Q) {
		if (*Q > 0) {
			invertroot(*Q,THETA);
		}
	}

}